

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O3

void ares_gethostbyname_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  uint uVar1;
  size_t sVar2;
  apattern *paVar3;
  undefined8 *puVar4;
  bool bVar5;
  hostent *phVar6;
  ares_status_t aVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  uint *puVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  ulong uVar16;
  hostent *hostent;
  ares_in6_addr a2;
  ares_in6_addr a1;
  hostent *local_80;
  uint local_74;
  ares_addrinfo *local_70;
  undefined8 *local_68;
  ulong local_60;
  anon_union_16_1_47ebf21e_for__S6_un local_58;
  anon_union_16_1_47ebf21e_for__S6_un local_48;
  
  uVar16 = CONCAT44(in_register_00000034,status);
  uVar14 = CONCAT44(in_register_00000014,timeouts);
  local_80 = (hostent *)0x0;
  if (status != 0) goto LAB_001108ab;
  aVar7 = ares_addrinfo2hostent(result,0,&local_80);
  phVar6 = local_80;
  uVar16 = (ulong)aVar7;
  if (local_80 == (hostent *)0x0 || aVar7 != ARES_SUCCESS) {
    if (aVar7 == ARES_SUCCESS) goto LAB_001106ba;
  }
  else {
    uVar16 = 1;
    if ((local_80->h_addr_list != (char **)0x0) && (*local_80->h_addr_list != (char *)0x0)) {
LAB_001106ba:
      sVar2 = *(size_t *)(*(long *)((long)arg + 0x10) + 0x50);
      uVar16 = 0;
      if (sVar2 != 0 && local_80 != (hostent *)0x0) {
        iVar8 = local_80->h_addrtype;
        local_70 = result;
        local_68 = (undefined8 *)arg;
        if (iVar8 == 10) {
          pcVar9 = *local_80->h_addr_list;
          if (pcVar9 == (char *)0x0) {
            iVar8 = 10;
          }
          else {
            paVar3 = *(apattern **)(*(long *)((long)arg + 0x10) + 0x48);
            uVar14 = 0;
            do {
              local_48._0_8_ = *(undefined8 *)pcVar9;
              local_48._8_8_ = *(undefined8 *)(pcVar9 + 8);
              sVar10 = get6_address_index((ares_in6_addr *)&local_48,paVar3,sVar2);
              uVar16 = uVar14;
              if (uVar14 == 0) {
                lVar12 = 0;
              }
              else {
                do {
                  local_58._0_8_ = *(undefined8 *)phVar6->h_addr_list[uVar16 - 1 & 0xffffffff];
                  local_58._8_8_ = *(undefined8 *)(phVar6->h_addr_list[uVar16 - 1 & 0xffffffff] + 8)
                  ;
                  sVar11 = get6_address_index((ares_in6_addr *)&local_58,paVar3,sVar2);
                  if (sVar11 <= sVar10) goto LAB_00110782;
                  pcVar9 = phVar6->h_addr_list[uVar16];
                  *(undefined8 *)pcVar9 = local_58._0_8_;
                  *(undefined8 *)(pcVar9 + 8) = local_58._8_8_;
                  bVar5 = 1 < (long)uVar16;
                  uVar16 = uVar16 - 1;
                } while (bVar5);
                uVar16 = 0;
LAB_00110782:
                lVar12 = (long)(int)uVar16 << 3;
                result = local_70;
                arg = local_68;
              }
              puVar4 = *(undefined8 **)((long)phVar6->h_addr_list + lVar12);
              *puVar4 = local_48._0_8_;
              puVar4[1] = local_48._8_8_;
              pcVar9 = phVar6->h_addr_list[uVar14 + 1];
              uVar14 = uVar14 + 1;
            } while (pcVar9 != (char *)0x0);
            iVar8 = local_80->h_addrtype;
          }
        }
        phVar6 = local_80;
        uVar16 = 0;
        if ((iVar8 == 2) && (puVar13 = (uint *)*local_80->h_addr_list, puVar13 != (uint *)0x0)) {
          paVar3 = *(apattern **)(*(long *)((long)arg + 0x10) + 0x48);
          sVar2 = *(size_t *)(*(long *)((long)arg + 0x10) + 0x50);
          uVar14 = 0;
          do {
            uVar15 = *puVar13;
            sVar10 = get_address_index((in_addr *)(ulong)uVar15,paVar3,sVar2);
            uVar16 = uVar14;
            if (uVar14 == 0) {
              lVar12 = 0;
            }
            else {
              do {
                local_60 = uVar16;
                local_74 = uVar15;
                uVar1 = *(uint *)phVar6->h_addr_list[uVar14 - 1 & 0xffffffff];
                sVar11 = get_address_index((in_addr *)(ulong)uVar1,paVar3,sVar2);
                uVar15 = local_74;
                if (sVar11 <= sVar10) goto LAB_00110863;
                *(uint *)phVar6->h_addr_list[uVar14] = uVar1;
                bVar5 = 1 < (long)uVar14;
                uVar14 = uVar14 - 1;
                uVar16 = local_60;
              } while (bVar5);
              uVar14 = 0;
LAB_00110863:
              lVar12 = (long)(int)uVar14 << 3;
              uVar14 = local_60;
            }
            **(uint **)((long)phVar6->h_addr_list + lVar12) = uVar15;
            puVar13 = (uint *)phVar6->h_addr_list[uVar14 + 1];
            uVar14 = uVar14 + 1;
          } while (puVar13 != (uint *)0x0);
          uVar16 = 0;
          result = local_70;
          arg = local_68;
        }
      }
    }
  }
  uVar14 = (ulong)(uint)timeouts;
LAB_001108ab:
  (**arg)(*(undefined8 *)((long)arg + 8),uVar16,uVar14,local_80);
  ares_freeaddrinfo(result);
  ares_free(arg);
  ares_free_hostent(local_80);
  return;
}

Assistant:

static void ares_gethostbyname_callback(void *arg, int status, int timeouts,
                                        struct ares_addrinfo *result)
{
  struct hostent    *hostent  = NULL;
  struct host_query *ghbn_arg = arg;

  if (status == ARES_SUCCESS) {
    status = (int)ares_addrinfo2hostent(result, AF_UNSPEC, &hostent);
  }

  /* addrinfo2hostent will only return ENODATA if there are no addresses _and_
   * no cname/aliases.  However, gethostbyname will return ENODATA even if there
   * is cname/alias data */
  if (status == ARES_SUCCESS && hostent &&
      (!hostent->h_addr_list || !hostent->h_addr_list[0])) {
    status = ARES_ENODATA;
  }

  if (status == ARES_SUCCESS && ghbn_arg->channel->nsort && hostent) {
    if (hostent->h_addrtype == AF_INET6) {
      sort6_addresses(hostent, ghbn_arg->channel->sortlist,
                      ghbn_arg->channel->nsort);
    }
    if (hostent->h_addrtype == AF_INET) {
      sort_addresses(hostent, ghbn_arg->channel->sortlist,
                     ghbn_arg->channel->nsort);
    }
  }

  ghbn_arg->callback(ghbn_arg->arg, status, timeouts, hostent);

  ares_freeaddrinfo(result);
  ares_free(ghbn_arg);
  ares_free_hostent(hostent);
}